

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

ssl_config_data * Curl_ssl_cf_get_config(Curl_cfilter *cf,Curl_easy *data)

{
  _Bool _Var1;
  ssl_config_data *local_20;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  _Var1 = Curl_ssl_cf_is_proxy(cf);
  if (_Var1) {
    local_20 = &(data->set).proxy_ssl;
  }
  else {
    local_20 = &(data->set).ssl;
  }
  return local_20;
}

Assistant:

struct ssl_config_data *
Curl_ssl_cf_get_config(struct Curl_cfilter *cf, struct Curl_easy *data)
{
#ifdef CURL_DISABLE_PROXY
  (void)cf;
  return &data->set.ssl;
#else
  return Curl_ssl_cf_is_proxy(cf) ? &data->set.proxy_ssl : &data->set.ssl;
#endif
}